

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddLessThan(InstructionBuilder *this,uint32_t op1,uint32_t op2)

{
  uint32_t id;
  int iVar1;
  DefUseManager *this_00;
  Instruction *pIVar2;
  TypeManager *this_01;
  Type *pTVar3;
  undefined4 extraout_var;
  
  this_00 = IRContext::get_def_use_mgr(this->context_);
  pIVar2 = analysis::DefUseManager::GetDef(this_00,op1);
  this_01 = IRContext::get_type_mgr(this->context_);
  id = Instruction::type_id(pIVar2);
  pTVar3 = analysis::TypeManager::GetType(this_01,id);
  iVar1 = (*pTVar3->_vptr_Type[9])(pTVar3);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assert_fail("int_type && \"Operand is not of int type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_builder.h"
                  ,0x157,
                  "Instruction *spvtools::opt::InstructionBuilder::AddLessThan(uint32_t, uint32_t)")
    ;
  }
  if (*(char *)(CONCAT44(extraout_var,iVar1) + 0x28) == '\x01') {
    pIVar2 = AddSLessThan(this,op1,op2);
    return pIVar2;
  }
  pIVar2 = AddULessThan(this,op1,op2);
  return pIVar2;
}

Assistant:

Instruction* AddLessThan(uint32_t op1, uint32_t op2) {
    Instruction* op1_insn = context_->get_def_use_mgr()->GetDef(op1);
    analysis::Type* type =
        GetContext()->get_type_mgr()->GetType(op1_insn->type_id());
    analysis::Integer* int_type = type->AsInteger();
    assert(int_type && "Operand is not of int type");

    if (int_type->IsSigned())
      return AddSLessThan(op1, op2);
    else
      return AddULessThan(op1, op2);
  }